

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

void bench_sign_run(void *arg,int iters)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uStack_e0;
  size_t siglen;
  uchar sig [74];
  secp256k1_ecdsa_signature signature;
  
  iVar3 = 0;
  if (iters < 1) {
    iters = 0;
  }
  while( true ) {
    if (iVar3 == iters) {
      return;
    }
    siglen = 0x4a;
    iVar1 = secp256k1_ecdsa_sign(*arg,&signature,(long)arg + 8,(long)arg + 0x28,0,0);
    if (iVar1 == 0) break;
    iVar1 = secp256k1_ecdsa_signature_serialize_der(*arg,sig,&siglen,&signature);
    if (iVar1 == 0) {
      pcVar4 = 
      "test condition failed: secp256k1_ecdsa_signature_serialize_der(data->ctx, sig, &siglen, &signature)"
      ;
      uStack_e0 = 0x7d;
      goto LAB_00103721;
    }
    for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 1) {
      *(uchar *)((long)arg + 0x28 + lVar2) = sig[lVar2 + 0x20];
      *(uchar *)((long)arg + lVar2 + 0x48) = sig[lVar2 + 0x40];
    }
    iVar3 = iVar3 + 1;
  }
  pcVar4 = 
  "test condition failed: secp256k1_ecdsa_sign(data->ctx, &signature, data->msg, data->key, NULL, NULL)"
  ;
  uStack_e0 = 0x7c;
LAB_00103721:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c",
          uStack_e0,pcVar4);
  abort();
}

Assistant:

static void bench_sign_run(void* arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    unsigned char sig[74];
    for (i = 0; i < iters; i++) {
        size_t siglen = 74;
        int j;
        secp256k1_ecdsa_signature signature;
        CHECK(secp256k1_ecdsa_sign(data->ctx, &signature, data->msg, data->key, NULL, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(data->ctx, sig, &siglen, &signature));
        for (j = 0; j < 32; j++) {
            data->msg[j] = sig[j];
            data->key[j] = sig[j + 32];
        }
    }
}